

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

Operator *
Operator::binary(Operator *__return_storage_ptr__,OperatorChar op,int precedence,
                OperatorAssociativity associativity,BinaryOperatorFn *applyFn)

{
  OperatorChar local_74;
  function<ResultValue_(ResultValue)> local_70;
  function<ResultValue_(ResultValue,_ResultValue)> local_50;
  undefined2 local_2c;
  undefined1 local_2a;
  BinaryOperatorFn *local_28;
  BinaryOperatorFn *applyFn_local;
  int local_18;
  OperatorAssociativity associativity_local;
  int precedence_local;
  OperatorChar op_local;
  
  local_2c = op._0_2_;
  local_2a = op.mOp2;
  local_28 = applyFn;
  applyFn_local._4_4_ = associativity;
  local_18 = precedence;
  associativity_local._1_2_ = local_2c;
  associativity_local._3_1_ = local_2a;
  _precedence_local = __return_storage_ptr__;
  std::function<ResultValue_(ResultValue,_ResultValue)>::function(&local_50,applyFn);
  std::function<ResultValue_(ResultValue)>::function(&local_70);
  local_74.mOp2 = local_2a;
  local_74.mIsTwoChars = (bool)(undefined1)local_2c;
  local_74.mOp1 = local_2c._1_1_;
  Operator(__return_storage_ptr__,local_74,precedence,associativity,false,&local_50,&local_70);
  std::function<ResultValue_(ResultValue)>::~function(&local_70);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Operator Operator::binary(OperatorChar op, int precedence, OperatorAssociativity associativity, BinaryOperatorFn applyFn) {
	return Operator(op, precedence, associativity, false, applyFn, {});
}